

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O1

void test_multiple_semaphores_waiting(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer psVar1;
  int iVar2;
  uint uVar3;
  shared_ptr<TestCase> *test_case;
  pointer psVar4;
  shared_ptr<TestCase> *test_case_1;
  pointer psVar5;
  uint unlocked_after;
  uint timeout;
  LockstepScheduler ls;
  undefined1 local_c1;
  shared_ptr<TestCase> local_c0;
  uint local_b0;
  uint local_ac;
  vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> local_a8;
  LockstepScheduler local_88;
  
  local_88.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x20] = '\0';
  local_88._65_8_ = 0;
  local_88.timed_waits_mutex_.super___mutex_base._M_mutex._16_8_ = 0;
  local_88.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x18] = '\0';
  local_88.timed_waits_mutex_.super___mutex_base._M_mutex._25_7_ = 0;
  local_88.timed_waits_mutex_.super___mutex_base._M_mutex.__align = 0;
  local_88.timed_waits_mutex_.super___mutex_base._M_mutex._8_8_ = 0;
  local_88.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.time_us_.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_88.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  LockstepScheduler::set_absolute_time(&local_88,0xbc614e);
  local_a8.
  super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ac = 0x2b67;
  local_b0 = 0x2b67;
  local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestCase,std::allocator<TestCase>,int,int,LockstepScheduler&>
            (&local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestCase **)&local_c0,(allocator<TestCase> *)&local_c1,(int *)&local_ac,
             (int *)&local_b0,&local_88);
  std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
  emplace_back<std::shared_ptr<TestCase>>
            ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)
             &local_a8,&local_c0);
  if (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_ac = 20000;
  local_b0 = 20000;
  local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestCase,std::allocator<TestCase>,int,int,LockstepScheduler&>
            (&local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestCase **)&local_c0,(allocator<TestCase> *)&local_c1,(int *)&local_ac,
             (int *)&local_b0,&local_88);
  std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
  emplace_back<std::shared_ptr<TestCase>>
            ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)
             &local_a8,&local_c0);
  if (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_ac = 0;
  local_b0 = 20000;
  local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestCase,std::allocator<TestCase>,int,int,LockstepScheduler&>
            (&local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestCase **)&local_c0,(allocator<TestCase> *)&local_c1,(int *)&local_ac,
             (int *)&local_b0,&local_88);
  std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
  emplace_back<std::shared_ptr<TestCase>>
            ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)
             &local_a8,&local_c0);
  if (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_ac = 20000;
  local_b0 = 10000;
  local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestCase,std::allocator<TestCase>,int,int,LockstepScheduler&>
            (&local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestCase **)&local_c0,(allocator<TestCase> *)&local_c1,(int *)&local_ac,
             (int *)&local_b0,&local_88);
  std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
  emplace_back<std::shared_ptr<TestCase>>
            ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)
             &local_a8,&local_c0);
  if (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_ac = 0;
  local_b0 = 0;
  local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestCase,std::allocator<TestCase>,int,int,LockstepScheduler&>
            (&local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestCase **)&local_c0,(allocator<TestCase> *)&local_c1,(int *)&local_ac,
             (int *)&local_b0,&local_88);
  std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
  emplace_back<std::shared_ptr<TestCase>>
            ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)
             &local_a8,&local_c0);
  if (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  iVar2 = random_number(1,0x14);
  psVar4 = local_a8.
           super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = local_a8.
           super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < iVar2) {
    do {
      local_ac = random_number(1,20000);
      local_b0 = random_number(1,20000);
      local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<TestCase,std::allocator<TestCase>,unsigned_int_const&,unsigned_int_const&,LockstepScheduler&>
                (&local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (TestCase **)&local_c0,(allocator<TestCase> *)&local_c1,&local_ac,&local_b0,
                 &local_88);
      std::vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>>::
      emplace_back<std::shared_ptr<TestCase>>
                ((vector<std::shared_ptr<TestCase>,std::allocator<std::shared_ptr<TestCase>>> *)
                 &local_a8,&local_c0);
      if (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      iVar2 = iVar2 + -1;
      psVar4 = local_a8.
               super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = local_a8.
               super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (iVar2 != 0);
  }
  for (; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    TestCase::run((psVar4->super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  uVar3 = 1;
  do {
    LockstepScheduler::set_absolute_time(&local_88,(ulong)(uVar3 + 0xbc614e));
    psVar1 = local_a8.
             super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = local_a8.
                  super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      TestCase::check((psVar4->super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
    iVar2 = random_number(1,100);
    psVar4 = local_a8.
             super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar1 = local_a8.
             super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = iVar2 + uVar3;
  } while (uVar3 < 0x4e85);
  psVar5 = local_a8.
           super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_a8.
      super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_a8.
      super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    do {
      this = (psVar5->super___shared_ptr<TestCase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar4);
    local_a8.
    super__Vector_base<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = psVar1;
  }
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::~vector
            (&local_a8);
  std::
  vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ::~vector(&local_88.timed_waits_);
  return;
}

Assistant:

void test_absolute_time()
{
    LockstepScheduler ls;
    ls.set_absolute_time(some_time_us);
    assert(ls.get_absolute_time() == some_time_us);
}